

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::IntFromDescriptor
          (ChContactContainerNSC *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  uint coffset;
  
  coffset = 0;
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_6_6,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_6_3,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_3_3,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_333_3,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_333_6,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
            (&coffset,&this->contactlist_333_333,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_666_3,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_666_6,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
            (&coffset,&this->contactlist_666_333,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
            (&coffset,&this->contactlist_666_666,off_v,v,off_L,L,3);
  _IntFromDescriptor<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_6_6_rolling,off_v,v,off_L,L,6);
  return;
}

Assistant:

void ChContactContainerNSC::IntFromDescriptor(const unsigned int off_v,
                                              ChStateDelta& v,
                                              const unsigned int off_L,
                                              ChVectorDynamic<>& L) {
    unsigned int coffset = 0;
    _IntFromDescriptor(coffset, contactlist_6_6, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_6_3, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_3_3, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_333_3, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_333_6, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_333_333, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_666_3, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_666_6, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_666_333, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_666_666, off_v, v, off_L, L, 3);
    _IntFromDescriptor(coffset, contactlist_6_6_rolling, off_v, v, off_L, L, 6);
}